

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_bnd.c
# Opt level: O0

int func(N_Vector u,N_Vector f,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int j;
  int i;
  sunrealtype *fdata;
  sunrealtype *udata;
  sunrealtype urt;
  sunrealtype ult;
  sunrealtype uup;
  sunrealtype udn;
  sunrealtype uij;
  sunrealtype vdc;
  sunrealtype hdc;
  sunrealtype vdiff;
  sunrealtype hdiff;
  sunrealtype dy;
  sunrealtype dx;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  
  lVar2 = N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  for (local_88 = 1; local_88 < 0x20; local_88 = local_88 + 1) {
    for (local_84 = 1; local_84 < 0x20; local_84 = local_84 + 1) {
      dVar1 = *(double *)(lVar2 + (long)(local_88 + -1 + (local_84 + -1) * 0x1f) * 8);
      if (local_88 == 1) {
        local_90 = 0.0;
      }
      else {
        local_90 = *(double *)(lVar2 + (long)(local_88 + -2 + (local_84 + -1) * 0x1f) * 8);
      }
      if (local_88 == 0x1f) {
        local_98 = 0.0;
      }
      else {
        local_98 = *(double *)(lVar2 + (long)(local_88 + (local_84 + -1) * 0x1f) * 8);
      }
      if (local_84 == 1) {
        local_a0 = 0.0;
      }
      else {
        local_a0 = *(double *)(lVar2 + (long)(local_88 + -1 + (local_84 + -2) * 0x1f) * 8);
      }
      if (local_84 == 0x1f) {
        local_a8 = 0.0;
      }
      else {
        local_a8 = *(double *)(lVar2 + (long)(local_88 + -1 + local_84 * 0x1f) * 8);
      }
      *(double *)(lVar3 + (long)(local_88 + -1 + (local_84 + -1) * 0x1f) * 8) =
           -(dVar1 * dVar1) * dVar1 +
           ((local_a0 - (dVar1 + dVar1)) + local_a8) * 1024.0 +
           ((local_98 - (dVar1 + dVar1)) + local_90) * 1024.0 + dVar1 + 2.0;
    }
  }
  return 0;
}

Assistant:

static int func(N_Vector u, N_Vector f, void* user_data)
{
  sunrealtype dx, dy, hdiff, vdiff;
  sunrealtype hdc, vdc;
  sunrealtype uij, udn, uup, ult, urt;
  sunrealtype *udata, *fdata;

  int i, j;

  dx  = ONE / (NX + 1);
  dy  = ONE / (NY + 1);
  hdc = ONE / (dx * dx);
  vdc = ONE / (dy * dy);

  udata = N_VGetArrayPointer(u);
  fdata = N_VGetArrayPointer(f);

  for (j = 1; j <= NY; j++)
  {
    for (i = 1; i <= NX; i++)
    {
      /* Extract u at x_i, y_j and four neighboring points */

      uij = IJth(udata, i, j);
      udn = (j == 1) ? ZERO : IJth(udata, i, j - 1);
      uup = (j == NY) ? ZERO : IJth(udata, i, j + 1);
      ult = (i == 1) ? ZERO : IJth(udata, i - 1, j);
      urt = (i == NX) ? ZERO : IJth(udata, i + 1, j);

      /* Evaluate diffusion components */

      hdiff = hdc * (ult - TWO * uij + urt);
      vdiff = vdc * (uup - TWO * uij + udn);

      /* Set residual at x_i, y_j */

      IJth(fdata, i, j) = hdiff + vdiff + uij - uij * uij * uij + 2.0;
    }
  }

  return (0);
}